

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O2

int Io_ReadBlifNetworkConnectBoxesOne(Io_ReadBlif_t *p,Abc_Ntk_t *pNtk,stmm_table *tName2Model)

{
  int iVar1;
  Abc_Obj_t *pBox;
  int i;
  
  i = 0;
  while( true ) {
    if (pNtk->vBoxes->nSize <= i) {
      Abc_NtkFinalizeRead(pNtk);
      return 0;
    }
    pBox = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vBoxes,i);
    if (((*(uint *)&pBox->field_0x14 & 0xf) == 10) &&
       (iVar1 = Io_ReadBlifNetworkConnectBoxesOneBox(p,pBox,tName2Model), iVar1 != 0)) break;
    i = i + 1;
  }
  return 1;
}

Assistant:

int Io_ReadBlifNetworkConnectBoxesOne( Io_ReadBlif_t * p, Abc_Ntk_t * pNtk, stmm_table * tName2Model )
{
    Abc_Obj_t * pBox;
    int i;
    // go through the boxes
    Abc_NtkForEachBlackbox( pNtk, pBox, i )
        if ( Io_ReadBlifNetworkConnectBoxesOneBox( p, pBox, tName2Model ) )
            return 1;
    Abc_NtkFinalizeRead( pNtk );
    return 0;
}